

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_rtree.cpp
# Opt level: O0

bool __thiscall
ON_RTree::Search(ON_RTree *this,double *a_min,double *a_max,
                _func_bool_void_ptr_ON__INT_PTR *a_resultCallback,void *a_context)

{
  undefined1 local_68 [8];
  ON_RTreeBBox rect;
  void *a_context_local;
  _func_bool_void_ptr_ON__INT_PTR *a_resultCallback_local;
  double *a_max_local;
  double *a_min_local;
  ON_RTree *this_local;
  
  if (this->m_root == (ON_RTreeNode *)0x0) {
    this_local._7_1_ = false;
  }
  else {
    local_68 = (undefined1  [8])*a_min;
    rect.m_min[0] = a_min[1];
    rect.m_min[1] = a_min[2];
    rect.m_min[2] = *a_max;
    rect.m_max[0] = a_max[1];
    rect.m_max[1] = a_max[2];
    rect.m_max[2] = (double)a_context;
    this_local._7_1_ = Search(this,(ON_RTreeBBox *)local_68,a_resultCallback,a_context);
  }
  return this_local._7_1_;
}

Assistant:

bool ON_RTree::Search(
  const double a_min[ON_RTree_NODE_DIM], const double a_max[ON_RTree_NODE_DIM], 
  bool ON_CALLBACK_CDECL a_resultCallback(void* a_context, ON__INT_PTR a_data),
  void* a_context
  ) const
{
  if ( 0 == m_root )
    return false;

  ON_RTreeBBox rect;
  memcpy(rect.m_min,a_min,sizeof(rect.m_min));
  memcpy(rect.m_max,a_max,sizeof(rect.m_max));
  return Search( &rect, a_resultCallback, a_context );
}